

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

id gpt_sample_top_k_top_p_repeat
             (gpt_vocab *vocab,float *logits,int32_t *last_n_tokens_data,
             size_t last_n_tokens_data_size,int top_k,double top_p,double temp,int repeat_last_n,
             float repeat_penalty,mt19937 *rng)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __wbegin;
  bool bVar1;
  result_type_conflict rVar2;
  size_type sVar3;
  reference pdVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  float *in_RSI;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  float in_XMM2_Da;
  int idx;
  discrete_distribution<int> dist;
  int i_3;
  int i_2;
  double cumsum;
  double *p_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<double,_std::allocator<double>_> *__range1_2;
  double p;
  pair<double,_int> *kv_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *__range1_1;
  double sum;
  vector<double,_std::allocator<double>_> probs;
  pair<double,_int> *kv;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *__range1;
  double maxl;
  int i_1;
  float scale;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> logits_id;
  int i;
  id max_id;
  float max_logit;
  vector<int,_std::allocator<int>_> last_n_tokens;
  float *plogits;
  int n_logits;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
  *in_stack_fffffffffffffd30;
  discrete_distribution<int> *pdVar8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd48;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd50;
  allocator_type *in_stack_fffffffffffffd58;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *__n;
  pair<float,_int> in_stack_fffffffffffffd60;
  int *in_stack_fffffffffffffd68;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd70;
  bool local_271;
  int local_208;
  int local_204;
  double local_200;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1e8;
  discrete_distribution<int> *local_1e0;
  double local_1d8;
  reference local_1d0;
  pair<double,_int> *local_1c8;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_1c0;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *local_1b8;
  double local_1b0;
  discrete_distribution<int> local_1a8;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *local_178;
  pointer local_170 [2];
  pair<double,_int> *local_160;
  pair<double,_int> *local_158;
  pair<double,_int> *local_150;
  pair<double,_int> *local_148;
  float local_13c;
  pair<float,_int> local_138;
  pair<double,_int> local_130;
  float local_11c;
  pair<float,_int> local_118;
  pair<double,_int> local_110;
  float local_fc;
  pair<float,_int> local_f8;
  pair<double,_int> local_f0;
  int *local_e0;
  int *local_d8;
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int local_b8;
  float local_b4;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_b0;
  undefined4 local_94;
  int local_90;
  id local_8c;
  float local_88;
  float *local_58;
  int local_4c;
  float local_48;
  int local_44;
  double local_40;
  double local_38;
  int local_2c;
  float *local_18;
  id local_4;
  
  local_48 = in_XMM2_Da;
  local_44 = in_R9D;
  local_40 = in_XMM1_Qa;
  local_38 = in_XMM0_Qa;
  local_2c = in_R8D;
  local_18 = in_RSI;
  sVar3 = std::
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x1293db);
  local_4c = (int)sVar3;
  local_58 = local_18;
  std::allocator<int>::allocator((allocator<int> *)0x129425);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58);
  std::allocator<int>::~allocator((allocator<int> *)0x129453);
  if (0.0 < local_40) {
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)0x12955f)
    ;
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
               in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
    local_b4 = (float)(1.0 / local_40);
    for (local_b8 = 0; local_b8 < local_4c; local_b8 = local_b8 + 1) {
      local_271 = false;
      if (0 < local_44) {
        local_d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        local_c8 = (int *)__gnu_cxx::
                          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator-((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_fffffffffffffd38._M_current,
                                    (difference_type)in_stack_fffffffffffffd30);
        local_d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        __last._M_current._4_4_ = in_stack_fffffffffffffd44;
        __last._M_current._0_4_ = in_stack_fffffffffffffd40;
        local_c0 = (int *)std::
                          find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                                    (in_stack_fffffffffffffd48,__last,
                                     (int *)in_stack_fffffffffffffd38._M_current);
        local_e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)
                                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        local_271 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)in_stack_fffffffffffffd30,
                               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      }
      if (local_271 == false) {
        local_13c = local_58[local_b8] * local_b4;
        in_stack_fffffffffffffd60 =
             std::make_pair<float,int&>
                       ((float *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                        (int *)0x129819);
        local_138 = in_stack_fffffffffffffd60;
        std::pair<double,_int>::pair<float,_int,_true>(&local_130,&local_138);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  (in_stack_fffffffffffffd30,
                   (value_type *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      }
      else if (0.0 < local_58[local_b8] || local_58[local_b8] == 0.0) {
        local_11c = (local_58[local_b8] * local_b4) / local_48;
        local_118 = std::make_pair<float,int&>
                              ((float *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ),(int *)0x129790);
        std::pair<double,_int>::pair<float,_int,_true>(&local_110,&local_118);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  (in_stack_fffffffffffffd30,
                   (value_type *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      }
      else {
        local_fc = local_58[local_b8] * local_b4 * local_48;
        local_f8 = std::make_pair<float,int&>
                             ((float *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                              ,(int *)0x1296e3);
        std::pair<double,_int>::pair<float,_int,_true>(&local_f0,&local_f8);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  (in_stack_fffffffffffffd30,
                   (value_type *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      }
    }
    __n = &local_b0;
    local_148 = (pair<double,_int> *)
                std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                          ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    local_158 = (pair<double,_int> *)
                std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                          ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    local_150 = (pair<double,_int> *)
                __gnu_cxx::
                __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                ::operator+((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                             *)in_stack_fffffffffffffd38._M_current,
                            (difference_type)in_stack_fffffffffffffd30);
    local_160 = (pair<double,_int> *)
                std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                          ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    std::
    partial_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,gpt_sample_top_k_top_p_repeat(gpt_vocab_const&,float_const*,int_const*,unsigned_long,int,double,double,int,float,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>
              (local_148,local_150,local_160);
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
               in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48._M_current);
    local_170[0] = (pointer)0xfff0000000000000;
    local_178 = &local_b0;
    local_1a8._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                  begin((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    local_1a8._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                              *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                               *)in_stack_fffffffffffffd30,
                              (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)),
          bVar1) {
      local_1a8._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           &__gnu_cxx::
            __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
            ::operator*((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                         *)((long)&local_1a8._M_param._M_cp.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + 0x10))->first;
      in_stack_fffffffffffffd50 =
           (vector<double,_std::allocator<double>_> *)
           std::max<double>((double *)local_170,
                            local_1a8._M_param._M_cp.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      local_170[0] = (((_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                        *)&in_stack_fffffffffffffd50->
                           super__Vector_base<double,_std::allocator<double>_>)->_M_impl).
                     super__Vector_impl_data._M_start;
      __gnu_cxx::
      __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
      ::operator++((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                    *)((long)&local_1a8._M_param._M_cp.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + 0x10));
    }
    pdVar8 = &local_1a8;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x1299d0);
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::size(&local_b0);
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd60,(size_type)__n);
    local_1b0 = 0.0;
    local_1b8 = &local_b0;
    local_1c0._M_current =
         (pair<double,_int> *)
         std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                   ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    local_1c8 = (pair<double,_int> *)
                std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                          ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                               *)in_stack_fffffffffffffd30,
                              (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)),
          bVar1) {
      local_1d0 = __gnu_cxx::
                  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  ::operator*(&local_1c0);
      local_1d8 = exp(local_1d0->first - (double)local_170[0]);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 in_stack_fffffffffffffd38._M_current);
      local_1b0 = local_1d8 + local_1b0;
      __gnu_cxx::
      __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
      ::operator++(&local_1c0);
    }
    local_1e0 = &local_1a8;
    local_1e8._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)
                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_fffffffffffffd30,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)),
          bVar1) {
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_1e8);
      *pdVar4 = *pdVar4 / local_1b0;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_1e8);
    }
    if (local_38 < 1.0) {
      local_200 = 0.0;
      for (local_204 = 0; local_204 < local_2c; local_204 = local_204 + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&local_1a8,(long)local_204);
        local_200 = *pvVar5 + local_200;
        if (local_38 <= local_200) {
          local_2c = local_204 + 1;
          std::vector<double,_std::allocator<double>_>::resize
                    (in_stack_fffffffffffffd50,(size_type)pdVar8);
          std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                    ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                     in_stack_fffffffffffffd50,(size_type)pdVar8);
          break;
        }
      }
      local_208 = 0;
      while (in_stack_fffffffffffffd44 = local_208,
            sVar6 = std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)&local_1a8),
            in_stack_fffffffffffffd44 < (int)sVar6) {
        in_stack_fffffffffffffd38._M_current = (double *)(1.0 / local_200);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&local_1a8,(long)local_208);
        *pvVar5 = (double)in_stack_fffffffffffffd38._M_current * *pvVar5;
        local_208 = local_208 + 1;
      }
    }
    pdVar8 = &local_1a8;
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    __wbegin._M_current._4_4_ = in_stack_fffffffffffffd44;
    __wbegin._M_current._0_4_ = in_stack_fffffffffffffd40;
    std::discrete_distribution<int>::
    discrete_distribution<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (pdVar8,__wbegin,in_stack_fffffffffffffd38);
    rVar2 = std::discrete_distribution<int>::operator()
                      (pdVar8,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    pvVar7 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[](&local_b0,(long)rVar2);
    local_4 = pvVar7->second;
    local_94 = 1;
    std::discrete_distribution<int>::~discrete_distribution((discrete_distribution<int> *)0x129d8f);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~vector
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  }
  else {
    local_88 = *local_58;
    local_8c = 0;
    for (local_90 = 1; local_90 < local_4c; local_90 = local_90 + 1) {
      if (local_88 < local_58[local_90]) {
        local_88 = local_58[local_90];
        local_8c = local_90;
      }
    }
    local_4 = local_8c;
    local_94 = 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  return local_4;
}

Assistant:

gpt_vocab::id gpt_sample_top_k_top_p_repeat(
        const gpt_vocab & vocab,
        const float * logits,
        const int32_t * last_n_tokens_data,
        size_t last_n_tokens_data_size,
        int    top_k,
        double top_p,
        double temp,
        int repeat_last_n,
        float repeat_penalty,
        std::mt19937 & rng) {

    int n_logits = vocab.id_to_token.size();

    const auto * plogits = logits;

    const auto last_n_tokens = std::vector<int32_t>(last_n_tokens_data, last_n_tokens_data + last_n_tokens_data_size);

    if (temp <= 0) {
        // select the token with the highest logit directly
        float max_logit = plogits[0];
        gpt_vocab::id max_id = 0;

        for (int i = 1; i < n_logits; ++i) {
            if (plogits[i] > max_logit) {
                max_logit = plogits[i];
                max_id = i;
            }
        }
        return max_id;
    }


    std::vector<std::pair<double, gpt_vocab::id>> logits_id;
    logits_id.reserve(n_logits);

    {
        const float scale = 1.0f/temp;
        for (int i = 0; i < n_logits; ++i) {
            // repetition penalty from ctrl paper (https://arxiv.org/abs/1909.05858)
            // credit https://github.com/facebookresearch/llama/compare/main...shawwn:llama:main
            if (repeat_last_n > 0 && std::find(last_n_tokens.end()-repeat_last_n, last_n_tokens.end(), i) != last_n_tokens.end()) {
                // if score < 0 then repetition penalty has to multiplied to reduce the previous token probability
                if (plogits[i] < 0.0f) {
                    logits_id.push_back(std::make_pair(plogits[i]*scale*repeat_penalty, i));
                } else {
                    logits_id.push_back(std::make_pair(plogits[i]*scale/repeat_penalty, i));
                }
            } else {
                logits_id.push_back(std::make_pair(plogits[i]*scale, i));
            }
        }
    }

    // find the top K tokens
    std::partial_sort(
            logits_id.begin(),
            logits_id.begin() + top_k, logits_id.end(),
            [](const std::pair<double, gpt_vocab::id> & a, const std::pair<double, gpt_vocab::id> & b) {
        return a.first > b.first;
    });

    logits_id.resize(top_k);

    double maxl = -INFINITY;
    for (const auto & kv : logits_id) {
        maxl = std::max(maxl, kv.first);
    }

    // compute probs for the top K tokens
    std::vector<double> probs;
    probs.reserve(logits_id.size());

    double sum = 0.0;
    for (const auto & kv : logits_id) {
        double p = exp(kv.first - maxl);
        probs.push_back(p);
        sum += p;
    }

    // normalize the probs
    for (auto & p : probs) {
        p /= sum;
    }

    if (top_p < 1.0f) {
        double cumsum = 0.0f;
        for (int i = 0; i < top_k; i++) {
            cumsum += probs[i];
            if (cumsum >= top_p) {
                top_k = i + 1;
                probs.resize(top_k);
                logits_id.resize(top_k);
                break;
            }
        }

        cumsum = 1.0/cumsum;
        for (int i = 0; i < (int) probs.size(); i++) {
            probs[i] *= cumsum;
        }
    }

//    printf("\n");
//    for (int i = 0; i < (int) probs.size(); i++) {
//    for (int i = 0; i < 10; i++) {
//        printf("%d: '%s' %f\n", i, vocab.id_to_token.at(logits_id[i].second).c_str(), probs[i]);
//    }

    std::discrete_distribution<> dist(probs.begin(), probs.end());
    int idx = dist(rng);

    return logits_id[idx].second;

}